

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_2_4_True(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  float *data;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  ulong uVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  float *pfVar37;
  long lVar38;
  int iVar39;
  float *pfVar40;
  long lVar41;
  long lVar42;
  int k_count;
  long lVar43;
  int iVar44;
  long lVar45;
  int iVar46;
  float *pfVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  undefined1 auVar83 [12];
  undefined1 auVar82 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [64];
  int data_width;
  
  auVar55._8_4_ = 0x80000000;
  auVar55._0_8_ = 0x8000000080000000;
  auVar55._12_4_ = 0x80000000;
  auVar56._8_4_ = 0x3effffff;
  auVar56._0_8_ = 0x3effffff3effffff;
  auVar56._12_4_ = 0x3effffff;
  auVar82 = ZEXT1664(auVar56);
  fVar61 = ipoint->scale;
  auVar86 = ZEXT464((uint)fVar61);
  auVar48 = vpternlogd_avx512vl(auVar56,ZEXT416((uint)fVar61),auVar55,0xf8);
  auVar48 = ZEXT416((uint)(fVar61 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  iVar15 = (int)auVar48._0_4_;
  fVar60 = -0.08 / (fVar61 * fVar61);
  auVar49 = vpternlogd_avx512vl(auVar56,ZEXT416((uint)ipoint->x),auVar55,0xf8);
  auVar49 = ZEXT416((uint)(ipoint->x + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50._0_8_ = (double)auVar49._0_4_;
  auVar50._8_8_ = auVar49._8_8_;
  auVar54._0_8_ = (double)fVar61;
  auVar54._8_8_ = 0;
  auVar49 = vfmadd231sd_fma(auVar50,auVar54,ZEXT816(0x3fe0000000000000));
  auVar53._0_4_ = (float)auVar49._0_8_;
  auVar53._4_12_ = auVar49._4_12_;
  auVar49 = vpternlogd_avx512vl(auVar56,ZEXT416((uint)ipoint->y),auVar55,0xf8);
  auVar49 = ZEXT416((uint)(ipoint->y + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar51._0_8_ = (double)auVar49._0_4_;
  auVar51._8_8_ = auVar49._8_8_;
  auVar49 = vfmadd231sd_fma(auVar51,auVar54,ZEXT816(0x3fe0000000000000));
  auVar52._0_4_ = (float)auVar49._0_8_;
  auVar52._4_12_ = auVar49._4_12_;
  auVar49._0_4_ = (int)auVar48._0_4_;
  auVar49._4_4_ = (int)auVar48._4_4_;
  auVar49._8_4_ = (int)auVar48._8_4_;
  auVar49._12_4_ = (int)auVar48._12_4_;
  auVar48 = vcvtdq2ps_avx(auVar49);
  fVar3 = auVar53._0_4_ - auVar48._0_4_;
  fVar4 = auVar52._0_4_ - auVar48._0_4_;
  auVar48 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar61),auVar53);
  auVar49 = vpternlogd_avx512vl(auVar56,auVar48,auVar55,0xf8);
  auVar48 = ZEXT416((uint)(auVar48._0_4_ + auVar49._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = ZEXT416((uint)fVar61);
  if (iVar15 < (int)auVar48._0_4_) {
    auVar48 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar49,auVar52);
    auVar57._8_4_ = 0x3effffff;
    auVar57._0_8_ = 0x3effffff3effffff;
    auVar57._12_4_ = 0x3effffff;
    auVar58._8_4_ = 0x80000000;
    auVar58._0_8_ = 0x8000000080000000;
    auVar58._12_4_ = 0x80000000;
    auVar50 = vpternlogd_avx512vl(auVar58,auVar48,auVar57,0xea);
    auVar48 = ZEXT416((uint)(auVar48._0_4_ + auVar50._0_4_));
    auVar48 = vroundss_avx(auVar48,auVar48,0xb);
    if (iVar15 < (int)auVar48._0_4_) {
      auVar48 = vfmadd231ss_fma(auVar53,auVar49,ZEXT416(0x41300000));
      auVar59._8_4_ = 0x80000000;
      auVar59._0_8_ = 0x8000000080000000;
      auVar59._12_4_ = 0x80000000;
      auVar50 = vpternlogd_avx512vl(auVar59,auVar48,auVar57,0xea);
      auVar48 = ZEXT416((uint)(auVar48._0_4_ + auVar50._0_4_));
      auVar48 = vroundss_avx(auVar48,auVar48,0xb);
      if ((int)auVar48._0_4_ + iVar15 <= iimage->width) {
        auVar48 = vfmadd231ss_fma(auVar52,auVar49,ZEXT416(0x41300000));
        auVar13._8_4_ = 0x80000000;
        auVar13._0_8_ = 0x8000000080000000;
        auVar13._12_4_ = 0x80000000;
        auVar50 = vpternlogd_avx512vl(auVar57,auVar48,auVar13,0xf8);
        auVar48 = ZEXT416((uint)(auVar48._0_4_ + auVar50._0_4_));
        auVar48 = vroundss_avx(auVar48,auVar48,0xb);
        if ((int)auVar48._0_4_ + iVar15 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          pfVar40 = iimage->data;
          iVar1 = iimage->data_width;
          iVar46 = iVar15 * 2;
          pfVar47 = haarResponseY + 0x1b;
          pfVar37 = haarResponseX + 0x1b;
          uVar16 = 0xfffffff4;
          do {
            auVar48._0_4_ = (float)(int)uVar16;
            auVar48._4_12_ = in_ZMM8._4_12_;
            auVar48 = vfmadd213ss_fma(auVar48,auVar49,ZEXT416((uint)(fVar4 + 0.5)));
            iVar19 = (int)auVar48._0_4_;
            auVar73._0_4_ = (float)(int)(uVar16 | 1);
            auVar73._4_12_ = in_ZMM8._4_12_;
            auVar48 = vfmadd213ss_fma(auVar73,auVar49,ZEXT416((uint)(fVar4 + 0.5)));
            iVar30 = (int)auVar48._0_4_;
            iVar27 = (iVar19 + -1) * iVar1;
            iVar29 = (iVar19 + -1 + iVar15) * iVar1;
            iVar31 = (iVar19 + -1 + iVar46) * iVar1;
            iVar32 = (iVar30 + -1) * iVar1;
            iVar19 = (iVar30 + -1 + iVar15) * iVar1;
            iVar30 = (iVar30 + -1 + iVar46) * iVar1;
            lVar23 = 0;
            do {
              iVar33 = (int)lVar23;
              auVar74._0_4_ = (float)(iVar33 + -0xc);
              auVar74._4_12_ = in_ZMM8._4_12_;
              auVar48 = vfmadd213ss_fma(auVar74,auVar49,ZEXT416((uint)fVar3));
              iVar44 = (int)auVar48._0_4_;
              auVar75._0_4_ = (float)(iVar33 + -0xb);
              auVar83 = auVar82._4_12_;
              auVar75._4_12_ = auVar83;
              auVar48 = vfmadd213ss_fma(auVar75,auVar49,ZEXT416((uint)fVar3));
              iVar34 = (int)auVar48._0_4_;
              auVar80._0_4_ = (float)(iVar33 + -10);
              auVar80._4_12_ = auVar83;
              auVar76._0_4_ = (float)(iVar33 + -9);
              auVar76._4_12_ = auVar83;
              iVar25 = iVar44 + -1 + iVar15;
              iVar39 = iVar44 + -1 + iVar46;
              auVar48 = vfmadd213ss_fma(auVar80,auVar49,ZEXT416((uint)fVar3));
              fVar61 = pfVar40[iVar29 + -1 + iVar44];
              fVar66 = pfVar40[iVar31 + -1 + iVar44];
              fVar70 = pfVar40[iVar31 + iVar39];
              fVar77 = pfVar40[iVar27 + -1 + iVar44];
              fVar5 = pfVar40[iVar27 + iVar39];
              auVar51 = SUB6416(ZEXT464(0x40000000),0);
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar27 + iVar25] -
                                                      pfVar40[iVar31 + iVar25])),auVar51,
                                        ZEXT416((uint)(fVar70 - fVar77)));
              fVar67 = pfVar40[iVar29 + iVar39];
              pfVar37[lVar23 + -0x1b] = (fVar66 - fVar5) + auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar67)),auVar51,
                                        ZEXT416((uint)(fVar70 - fVar77)));
              pfVar47[lVar23 + -0x1b] = auVar50._0_4_ - (fVar66 - fVar5);
              fVar61 = pfVar40[iVar19 + -1 + iVar44];
              fVar66 = pfVar40[iVar30 + -1 + iVar44];
              in_ZMM8 = ZEXT464((uint)pfVar40[iVar39 + iVar30]);
              iVar20 = (int)auVar48._0_4_;
              auVar48 = vfmadd213ss_fma(auVar76,auVar49,ZEXT416((uint)fVar3));
              fVar70 = pfVar40[iVar32 + iVar39];
              auVar52 = ZEXT416((uint)(pfVar40[iVar39 + iVar30] - pfVar40[iVar32 + -1 + iVar44]));
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar32 + iVar25] -
                                                      pfVar40[iVar25 + iVar30])),auVar51,auVar52);
              fVar77 = pfVar40[iVar19 + iVar39];
              pfVar37[lVar23 + -3] = (fVar66 - fVar70) + auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar77)),auVar51,auVar52);
              pfVar47[lVar23 + -3] = auVar50._0_4_ - (fVar66 - fVar70);
              iVar25 = iVar34 + -1 + iVar15;
              iVar44 = iVar34 + -1 + iVar46;
              fVar61 = pfVar40[iVar29 + -1 + iVar34];
              fVar66 = pfVar40[iVar31 + -1 + iVar34];
              fVar70 = pfVar40[iVar31 + iVar44];
              fVar77 = pfVar40[iVar27 + -1 + iVar34];
              fVar5 = pfVar40[iVar27 + iVar44];
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar27 + iVar25] -
                                                      pfVar40[iVar31 + iVar25])),auVar51,
                                        ZEXT416((uint)(fVar70 - fVar77)));
              fVar67 = pfVar40[iVar29 + iVar44];
              pfVar37[lVar23 + -0x1a] = (fVar66 - fVar5) + auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar67)),auVar51,
                                        ZEXT416((uint)(fVar70 - fVar77)));
              pfVar47[lVar23 + -0x1a] = auVar50._0_4_ - (fVar66 - fVar5);
              fVar61 = pfVar40[iVar19 + -1 + iVar34];
              fVar66 = pfVar40[iVar30 + -1 + iVar34];
              auVar82 = ZEXT464((uint)pfVar40[iVar44 + iVar30]);
              iVar39 = (int)auVar48._0_4_;
              fVar70 = pfVar40[iVar32 + iVar44];
              auVar50 = ZEXT416((uint)(pfVar40[iVar44 + iVar30] - pfVar40[iVar32 + -1 + iVar34]));
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar32 + iVar25] -
                                                      pfVar40[iVar25 + iVar30])),auVar51,auVar50);
              fVar77 = pfVar40[iVar19 + iVar44];
              pfVar37[lVar23 + -2] = (fVar66 - fVar70) + auVar48._0_4_;
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar77)),auVar51,auVar50);
              pfVar47[lVar23 + -2] = auVar48._0_4_ - (fVar66 - fVar70);
              iVar34 = iVar20 + -1 + iVar15;
              iVar25 = iVar20 + -1 + iVar46;
              fVar61 = pfVar40[iVar29 + -1 + iVar20];
              fVar66 = pfVar40[iVar31 + -1 + iVar20];
              fVar70 = pfVar40[iVar31 + iVar25];
              fVar77 = pfVar40[iVar27 + -1 + iVar20];
              fVar5 = pfVar40[iVar27 + iVar25];
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar27 + iVar34] -
                                                      pfVar40[iVar31 + iVar34])),auVar51,
                                        ZEXT416((uint)(fVar70 - fVar77)));
              fVar67 = pfVar40[iVar29 + iVar25];
              pfVar37[lVar23 + -0x19] = (fVar66 - fVar5) + auVar48._0_4_;
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar67)),auVar51,
                                        ZEXT416((uint)(fVar70 - fVar77)));
              pfVar47[lVar23 + -0x19] = auVar48._0_4_ - (fVar66 - fVar5);
              fVar61 = pfVar40[iVar19 + -1 + iVar20];
              fVar66 = pfVar40[iVar30 + -1 + iVar20];
              fVar70 = pfVar40[iVar25 + iVar30];
              fVar77 = pfVar40[iVar32 + -1 + iVar20];
              fVar5 = pfVar40[iVar32 + iVar25];
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar32 + iVar34] -
                                                      pfVar40[iVar34 + iVar30])),auVar51,
                                        ZEXT416((uint)(fVar70 - fVar77)));
              fVar67 = pfVar40[iVar19 + iVar25];
              pfVar37[lVar23 + -1] = (fVar66 - fVar5) + auVar48._0_4_;
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar67)),auVar51,
                                        ZEXT416((uint)(fVar70 - fVar77)));
              pfVar47[lVar23 + -1] = auVar48._0_4_ - (fVar66 - fVar5);
              iVar34 = iVar39 + -1 + iVar15;
              iVar25 = iVar39 + -1 + iVar46;
              fVar61 = pfVar40[iVar29 + -1 + iVar39];
              fVar66 = pfVar40[iVar31 + -1 + iVar39];
              fVar70 = pfVar40[iVar31 + iVar25];
              fVar77 = pfVar40[iVar27 + -1 + iVar39];
              fVar5 = pfVar40[iVar27 + iVar25];
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar27 + iVar34] -
                                                      pfVar40[iVar31 + iVar34])),auVar51,
                                        ZEXT416((uint)(fVar70 - fVar77)));
              fVar67 = pfVar40[iVar29 + iVar25];
              pfVar37[lVar23 + -0x18] = (fVar66 - fVar5) + auVar48._0_4_;
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar67)),auVar51,
                                        ZEXT416((uint)(fVar70 - fVar77)));
              pfVar47[lVar23 + -0x18] = auVar48._0_4_ - (fVar66 - fVar5);
              fVar61 = pfVar40[iVar19 + -1 + iVar39];
              fVar66 = pfVar40[iVar30 + -1 + iVar39];
              fVar70 = pfVar40[iVar25 + iVar30];
              fVar77 = pfVar40[iVar32 + -1 + iVar39];
              fVar5 = pfVar40[iVar32 + iVar25];
              fVar67 = pfVar40[iVar19 + iVar25];
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar32 + iVar34] -
                                                      pfVar40[iVar34 + iVar30])),auVar51,
                                        ZEXT416((uint)(fVar70 - fVar77)));
              pfVar37[lVar23] = (fVar66 - fVar5) + auVar48._0_4_;
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar67)),auVar51,
                                        ZEXT416((uint)(fVar70 - fVar77)));
              pfVar47[lVar23] = auVar48._0_4_ - (fVar66 - fVar5);
              lVar23 = lVar23 + 4;
            } while (iVar33 + -0xc < 8);
            pfVar47 = pfVar47 + 0x30;
            pfVar37 = pfVar37 + 0x30;
            bVar2 = (int)uVar16 < 10;
            uVar16 = uVar16 + 2;
          } while (bVar2);
          goto LAB_001beb3c;
        }
      }
    }
  }
  iVar1 = iVar15 * 2;
  lVar23 = 0;
  uVar16 = 0xfffffff4;
  do {
    auVar62._0_4_ = (float)(int)uVar16;
    auVar62._4_12_ = in_ZMM8._4_12_;
    auVar48 = vfmadd213ss_fma(auVar62,auVar86._0_16_,ZEXT416((uint)fVar4));
    auVar64._0_4_ = (float)(int)(uVar16 | 1);
    auVar64._4_12_ = in_ZMM8._4_12_;
    auVar50 = vfmadd213ss_fma(auVar64,auVar86._0_16_,ZEXT416((uint)fVar4));
    fVar61 = auVar48._0_4_;
    iVar19 = (int)((double)((ulong)(0.0 <= fVar61) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar61) * -0x4020000000000000) + (double)fVar61);
    fVar61 = auVar50._0_4_;
    iVar27 = (int)((double)((ulong)(0.0 <= fVar61) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar61) * -0x4020000000000000) + (double)fVar61);
    iVar29 = iVar1 + iVar19;
    iVar30 = iVar19 + -1;
    iVar31 = iVar19 + -1 + iVar15;
    iVar32 = iVar1 + iVar27;
    iVar33 = iVar27 + -1;
    iVar34 = iVar27 + -1 + iVar15;
    lVar22 = lVar23;
    iVar46 = -0xc;
    do {
      auVar63._0_4_ = (float)iVar46;
      auVar83 = in_ZMM8._4_12_;
      auVar63._4_12_ = auVar83;
      auVar52 = auVar86._0_16_;
      auVar48 = vfmadd213ss_fma(auVar63,auVar52,ZEXT416((uint)fVar3));
      auVar78._0_4_ = (float)(iVar46 + 1);
      auVar78._4_12_ = auVar83;
      auVar50 = vfmadd213ss_fma(auVar78,auVar52,ZEXT416((uint)fVar3));
      auVar71._0_4_ = (float)(iVar46 + 2);
      auVar71._4_12_ = auVar83;
      auVar51 = vfmadd213ss_fma(auVar71,auVar52,ZEXT416((uint)fVar3));
      auVar68._0_4_ = (float)(iVar46 + 3);
      auVar68._4_12_ = auVar83;
      auVar52 = vfmadd213ss_fma(auVar68,auVar52,ZEXT416((uint)fVar3));
      fVar61 = auVar48._0_4_;
      fVar77 = auVar50._0_4_;
      fVar70 = auVar51._0_4_;
      fVar66 = auVar52._0_4_;
      pfVar40 = (float *)((long)haarResponseY + lVar22);
      iVar25 = (int)((double)((ulong)(0.0 <= fVar61) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar61) * -0x4020000000000000) + (double)fVar61);
      if ((((iVar19 < 1) || (iVar25 < 1)) || (iimage->height < iVar29)) ||
         (iVar44 = iVar1 + iVar25, iimage->width < iVar44)) {
        haarXY(iimage,iVar19,iVar25,iVar15,(float *)((long)haarResponseX + lVar22),pfVar40);
      }
      else {
        iVar28 = iVar25 + -1 + iVar15;
        pfVar47 = iimage->data;
        iVar39 = iimage->data_width;
        iVar20 = iVar39 * iVar30;
        fVar61 = pfVar47[iVar39 * iVar31 + -1 + iVar25];
        iVar35 = iVar39 * (iVar1 + -1 + iVar19);
        fVar5 = pfVar47[iVar35 + -1 + iVar25];
        fVar67 = pfVar47[iVar35 + -1 + iVar44];
        fVar6 = pfVar47[iVar20 + -1 + iVar25];
        fVar7 = pfVar47[iVar20 + -1 + iVar44];
        fVar8 = pfVar47[iVar39 * iVar31 + -1 + iVar44];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar20 + iVar28] - pfVar47[iVar35 + iVar28]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar67 - fVar6)));
        *(float *)((long)haarResponseX + lVar22) = (fVar5 - fVar7) + auVar48._0_4_;
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar8)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar67 - fVar6)));
        *pfVar40 = auVar48._0_4_ - (fVar5 - fVar7);
      }
      pfVar40 = (float *)((long)haarResponseX + lVar22 + 0x60);
      pfVar47 = (float *)((long)haarResponseY + lVar22 + 0x60);
      if (((iVar27 < 1) || (iVar25 < 1)) ||
         ((iimage->height < iVar32 || (iVar44 = iVar1 + iVar25, iimage->width < iVar44)))) {
        haarXY(iimage,iVar27,iVar25,iVar15,pfVar40,pfVar47);
      }
      else {
        iVar20 = iVar25 + -1 + iVar15;
        pfVar37 = iimage->data;
        iVar39 = iimage->data_width;
        iVar35 = iVar39 * iVar33;
        fVar61 = pfVar37[iVar39 * iVar34 + -1 + iVar25];
        iVar28 = iVar39 * (iVar1 + -1 + iVar27);
        fVar5 = pfVar37[iVar28 + -1 + iVar25];
        fVar67 = pfVar37[iVar28 + -1 + iVar44];
        fVar6 = pfVar37[iVar35 + -1 + iVar25];
        fVar7 = pfVar37[iVar35 + -1 + iVar44];
        fVar8 = pfVar37[iVar39 * iVar34 + -1 + iVar44];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar35 + iVar20] - pfVar37[iVar28 + iVar20]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar67 - fVar6)));
        *pfVar40 = (fVar5 - fVar7) + auVar48._0_4_;
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar8)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar67 - fVar6)));
        *pfVar47 = auVar48._0_4_ - (fVar5 - fVar7);
      }
      iVar25 = (int)((double)((ulong)(0.0 <= fVar77) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar77) * -0x4020000000000000) + (double)fVar77);
      pfVar40 = (float *)((long)haarResponseX + lVar22 + 4);
      pfVar47 = (float *)((long)haarResponseY + lVar22 + 4);
      if (((iVar19 < 1) || (iVar25 < 1)) ||
         ((iimage->height < iVar29 || (iVar44 = iVar1 + iVar25, iimage->width < iVar44)))) {
        haarXY(iimage,iVar19,iVar25,iVar15,pfVar40,pfVar47);
      }
      else {
        iVar28 = iVar25 + -1 + iVar15;
        pfVar37 = iimage->data;
        iVar39 = iimage->data_width;
        iVar20 = iVar39 * iVar30;
        fVar61 = pfVar37[iVar39 * iVar31 + -1 + iVar25];
        iVar35 = iVar39 * (iVar1 + -1 + iVar19);
        fVar77 = pfVar37[iVar35 + -1 + iVar25];
        fVar5 = pfVar37[iVar35 + -1 + iVar44];
        fVar67 = pfVar37[iVar20 + -1 + iVar25];
        fVar6 = pfVar37[iVar20 + -1 + iVar44];
        fVar7 = pfVar37[iVar39 * iVar31 + -1 + iVar44];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar20 + iVar28] - pfVar37[iVar35 + iVar28]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar67)));
        *pfVar40 = (fVar77 - fVar6) + auVar48._0_4_;
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar67)));
        *pfVar47 = auVar48._0_4_ - (fVar77 - fVar6);
      }
      pfVar40 = (float *)((long)haarResponseX + lVar22 + 100);
      pfVar47 = (float *)((long)haarResponseY + lVar22 + 100);
      if ((((iVar27 < 1) || (iVar25 < 1)) || (iimage->height < iVar32)) ||
         (iVar44 = iVar1 + iVar25, iimage->width < iVar44)) {
        haarXY(iimage,iVar27,iVar25,iVar15,pfVar40,pfVar47);
      }
      else {
        iVar20 = iVar25 + -1 + iVar15;
        pfVar37 = iimage->data;
        iVar39 = iimage->data_width;
        iVar35 = iVar39 * iVar33;
        fVar61 = pfVar37[iVar39 * iVar34 + -1 + iVar25];
        iVar28 = iVar39 * (iVar1 + -1 + iVar27);
        fVar77 = pfVar37[iVar28 + -1 + iVar25];
        fVar5 = pfVar37[iVar28 + -1 + iVar44];
        fVar67 = pfVar37[iVar35 + -1 + iVar25];
        fVar6 = pfVar37[iVar35 + -1 + iVar44];
        fVar7 = pfVar37[iVar39 * iVar34 + -1 + iVar44];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar35 + iVar20] - pfVar37[iVar28 + iVar20]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar67)));
        *pfVar40 = (fVar77 - fVar6) + auVar48._0_4_;
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar67)));
        *pfVar47 = auVar48._0_4_ - (fVar77 - fVar6);
      }
      iVar25 = (int)((double)((ulong)(0.0 <= fVar70) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar70) * -0x4020000000000000) + (double)fVar70);
      pfVar40 = (float *)((long)haarResponseX + lVar22 + 8);
      pfVar47 = (float *)((long)haarResponseY + lVar22 + 8);
      if (((iVar19 < 1) || (iVar25 < 1)) ||
         ((iimage->height < iVar29 || (iVar44 = iVar1 + iVar25, iimage->width < iVar44)))) {
        haarXY(iimage,iVar19,iVar25,iVar15,pfVar40,pfVar47);
      }
      else {
        iVar28 = iVar25 + -1 + iVar15;
        pfVar37 = iimage->data;
        iVar39 = iimage->data_width;
        iVar20 = iVar39 * iVar30;
        fVar61 = pfVar37[iVar39 * iVar31 + -1 + iVar25];
        iVar35 = iVar39 * (iVar1 + -1 + iVar19);
        fVar70 = pfVar37[iVar35 + -1 + iVar25];
        fVar77 = pfVar37[iVar35 + -1 + iVar44];
        fVar5 = pfVar37[iVar20 + -1 + iVar25];
        fVar67 = pfVar37[iVar20 + -1 + iVar44];
        fVar6 = pfVar37[iVar39 * iVar31 + -1 + iVar44];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar20 + iVar28] - pfVar37[iVar35 + iVar28]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar77 - fVar5)));
        *pfVar40 = (fVar70 - fVar67) + auVar48._0_4_;
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar6)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar77 - fVar5)));
        *pfVar47 = auVar48._0_4_ - (fVar70 - fVar67);
      }
      pfVar40 = (float *)((long)haarResponseX + lVar22 + 0x68);
      pfVar47 = (float *)((long)haarResponseY + lVar22 + 0x68);
      if (((iVar27 < 1) || (iVar25 < 1)) ||
         ((iimage->height < iVar32 || (iVar44 = iVar1 + iVar25, iimage->width < iVar44)))) {
        haarXY(iimage,iVar27,iVar25,iVar15,pfVar40,pfVar47);
      }
      else {
        iVar20 = iVar25 + -1 + iVar15;
        pfVar37 = iimage->data;
        iVar39 = iimage->data_width;
        iVar35 = iVar39 * iVar33;
        fVar61 = pfVar37[iVar39 * iVar34 + -1 + iVar25];
        iVar28 = iVar39 * (iVar1 + -1 + iVar27);
        fVar70 = pfVar37[iVar28 + -1 + iVar25];
        fVar77 = pfVar37[iVar28 + -1 + iVar44];
        fVar5 = pfVar37[iVar35 + -1 + iVar25];
        fVar67 = pfVar37[iVar35 + -1 + iVar44];
        fVar6 = pfVar37[iVar39 * iVar34 + -1 + iVar44];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar35 + iVar20] - pfVar37[iVar28 + iVar20]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar77 - fVar5)));
        *pfVar40 = (fVar70 - fVar67) + auVar48._0_4_;
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar6)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar77 - fVar5)));
        *pfVar47 = auVar48._0_4_ - (fVar70 - fVar67);
      }
      iVar25 = (int)((double)((ulong)(0.0 <= fVar66) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar66) * -0x4020000000000000) + (double)fVar66);
      pfVar40 = (float *)((long)haarResponseX + lVar22 + 0xc);
      pfVar47 = (float *)((long)haarResponseY + lVar22 + 0xc);
      if ((((iVar19 < 1) || (iVar25 < 1)) || (iimage->height < iVar29)) ||
         (iVar44 = iVar1 + iVar25, iimage->width < iVar44)) {
        haarXY(iimage,iVar19,iVar25,iVar15,pfVar40,pfVar47);
      }
      else {
        iVar28 = iVar25 + -1 + iVar15;
        pfVar37 = iimage->data;
        iVar39 = iimage->data_width;
        iVar20 = iVar39 * iVar30;
        fVar61 = pfVar37[iVar39 * iVar31 + -1 + iVar25];
        iVar35 = iVar39 * (iVar1 + -1 + iVar19);
        fVar66 = pfVar37[iVar35 + -1 + iVar25];
        fVar70 = pfVar37[iVar35 + -1 + iVar44];
        fVar77 = pfVar37[iVar20 + -1 + iVar25];
        fVar5 = pfVar37[iVar20 + -1 + iVar44];
        fVar67 = pfVar37[iVar39 * iVar31 + -1 + iVar44];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar20 + iVar28] - pfVar37[iVar35 + iVar28]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar70 - fVar77)));
        *pfVar40 = (fVar66 - fVar5) + auVar48._0_4_;
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar67)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar70 - fVar77)));
        *pfVar47 = auVar48._0_4_ - (fVar66 - fVar5);
      }
      pfVar40 = (float *)((long)haarResponseX + lVar22 + 0x6c);
      pfVar47 = (float *)((long)haarResponseY + lVar22 + 0x6c);
      if (((iVar27 < 1) || (iVar25 < 1)) ||
         ((iimage->height < iVar32 || (iVar44 = iVar1 + iVar25, iimage->width < iVar44)))) {
        haarXY(iimage,iVar27,iVar25,iVar15,pfVar40,pfVar47);
      }
      else {
        iVar20 = iVar25 + -1 + iVar15;
        pfVar37 = iimage->data;
        iVar39 = iimage->data_width;
        iVar35 = iVar39 * iVar33;
        fVar61 = pfVar37[iVar39 * iVar34 + -1 + iVar25];
        iVar28 = iVar39 * (iVar1 + -1 + iVar27);
        fVar66 = pfVar37[iVar28 + -1 + iVar25];
        fVar70 = pfVar37[iVar28 + -1 + iVar44];
        fVar77 = pfVar37[iVar35 + -1 + iVar25];
        fVar5 = pfVar37[iVar35 + -1 + iVar44];
        fVar67 = pfVar37[iVar39 * iVar34 + -1 + iVar44];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar35 + iVar20] - pfVar37[iVar28 + iVar20]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar70 - fVar77)));
        *pfVar40 = (fVar66 - fVar5) + auVar48._0_4_;
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar67)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar70 - fVar77)));
        *pfVar47 = auVar48._0_4_ - (fVar66 - fVar5);
      }
      auVar86 = ZEXT1664(auVar49);
      lVar22 = lVar22 + 0x10;
      bVar2 = iVar46 < 8;
      iVar46 = iVar46 + 4;
    } while (bVar2);
    lVar23 = lVar23 + 0xc0;
    bVar2 = (int)uVar16 < 10;
    uVar16 = uVar16 + 2;
  } while (bVar2);
LAB_001beb3c:
  fVar61 = auVar86._0_4_;
  auVar85._8_4_ = 0x3effffff;
  auVar85._0_8_ = 0x3effffff3effffff;
  auVar85._12_4_ = 0x3effffff;
  auVar84._8_4_ = 0x80000000;
  auVar84._0_8_ = 0x8000000080000000;
  auVar84._12_4_ = 0x80000000;
  auVar48 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar61 * 0.5)),auVar84,0xf8);
  auVar48 = ZEXT416((uint)(fVar61 * 0.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar61 * 1.5)),auVar84,0xf8);
  auVar49 = ZEXT416((uint)(fVar61 * 1.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar61 * 2.5)),auVar84,0xf8);
  auVar50 = ZEXT416((uint)(fVar61 * 2.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar61 * 3.5)),auVar84,0xf8);
  auVar51 = ZEXT416((uint)(fVar61 * 3.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar61 * 4.5)),auVar84,0xf8);
  auVar52 = ZEXT416((uint)(fVar61 * 4.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar61 * 5.5)),auVar84,0xf8);
  auVar53 = ZEXT416((uint)(fVar61 * 5.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar61 * 6.5)),auVar84,0xf8);
  auVar54 = ZEXT416((uint)(fVar61 * 6.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar61 * 7.5)),auVar84,0xf8);
  auVar55 = ZEXT416((uint)(auVar55._0_4_ + fVar61 * 7.5));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar61 * 8.5)),auVar84,0xf8);
  auVar56 = ZEXT416((uint)(fVar61 * 8.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar61 * 9.5)),auVar84,0xf8);
  auVar57 = ZEXT416((uint)(fVar61 * 9.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar61 * 10.5)),auVar84,0xf8);
  auVar58 = ZEXT416((uint)(fVar61 * 10.5 + auVar58._0_4_));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar61 * 11.5)),auVar84,0xf8);
  auVar59 = ZEXT416((uint)(fVar61 * 11.5 + auVar59._0_4_));
  auVar59 = vroundss_avx(auVar59,auVar59,0xb);
  fVar67 = auVar50._0_4_;
  fVar61 = fVar67 + auVar49._0_4_;
  fVar3 = fVar67 + auVar48._0_4_;
  fVar4 = fVar67 - auVar48._0_4_;
  fVar66 = fVar67 - auVar49._0_4_;
  fVar70 = fVar67 - auVar51._0_4_;
  fVar77 = fVar67 - auVar52._0_4_;
  fVar5 = fVar67 - auVar53._0_4_;
  fVar67 = fVar67 - auVar54._0_4_;
  fVar81 = auVar55._0_4_;
  fVar6 = fVar81 - auVar51._0_4_;
  fVar7 = fVar81 - auVar52._0_4_;
  fVar8 = fVar81 - auVar53._0_4_;
  fVar9 = fVar81 - auVar54._0_4_;
  fVar10 = fVar81 - auVar56._0_4_;
  fVar11 = fVar81 - auVar57._0_4_;
  fVar12 = fVar81 - auVar58._0_4_;
  fVar81 = fVar81 - auVar59._0_4_;
  gauss_s1_c0[0] = expf(fVar61 * fVar61 * fVar60);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar60);
  gauss_s1_c0[2] = expf(fVar4 * fVar4 * fVar60);
  gauss_s1_c0[3] = expf(fVar66 * fVar66 * fVar60);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar70 * fVar70 * fVar60);
  gauss_s1_c0[6] = expf(fVar77 * fVar77 * fVar60);
  gauss_s1_c0[7] = expf(fVar5 * fVar5 * fVar60);
  gauss_s1_c0[8] = expf(fVar67 * fVar67 * fVar60);
  gauss_s1_c1[0] = expf(fVar6 * fVar6 * fVar60);
  gauss_s1_c1[1] = expf(fVar7 * fVar7 * fVar60);
  gauss_s1_c1[2] = expf(fVar8 * fVar8 * fVar60);
  gauss_s1_c1[3] = expf(fVar9 * fVar9 * fVar60);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar10 * fVar10 * fVar60);
  gauss_s1_c1[6] = expf(fVar11 * fVar11 * fVar60);
  gauss_s1_c1[7] = expf(fVar12 * fVar12 * fVar60);
  gauss_s1_c1[8] = expf(fVar81 * fVar81 * fVar60);
  uVar17 = 0xfffffff8;
  lVar23 = 0;
  fVar61 = 0.0;
  auVar65._8_4_ = 0x7fffffff;
  auVar65._0_8_ = 0x7fffffff7fffffff;
  auVar65._12_4_ = 0x7fffffff;
  lVar22 = 0;
  lVar41 = 0;
  do {
    pfVar40 = gauss_s1_c1;
    uVar16 = (uint)uVar17;
    if (uVar16 != 7) {
      pfVar40 = gauss_s1_c0;
    }
    if (uVar16 == 0xfffffff8) {
      pfVar40 = gauss_s1_c1;
    }
    lVar22 = (long)(int)lVar22;
    iVar15 = (int)lVar41;
    lVar41 = (long)iVar15;
    lVar38 = (long)haarResponseX + lVar23;
    lVar24 = (long)haarResponseY + lVar23;
    uVar36 = 0xfffffff8;
    uVar26 = 0;
    do {
      pfVar47 = gauss_s1_c1;
      if (uVar36 != 7) {
        pfVar47 = gauss_s1_c0;
      }
      if (uVar36 == 0xfffffff8) {
        pfVar47 = gauss_s1_c1;
      }
      uVar18 = (ulong)(uVar36 >> 0x1c & 0xfffffff8);
      auVar82 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar21 = uVar26;
      lVar43 = lVar38;
      lVar45 = lVar24;
      do {
        lVar42 = 0;
        pfVar37 = (float *)((long)pfVar40 + (ulong)(uint)((int)(uVar17 >> 0x1f) << 5));
        do {
          fVar3 = pfVar47[uVar18] * *pfVar37;
          auVar48 = vinsertps_avx(ZEXT416(*(uint *)(lVar45 + lVar42 * 4)),
                                  ZEXT416(*(uint *)(lVar43 + lVar42 * 4)),0x10);
          auVar79._0_4_ = fVar3 * auVar48._0_4_;
          auVar79._4_4_ = fVar3 * auVar48._4_4_;
          auVar79._8_4_ = fVar3 * auVar48._8_4_;
          auVar79._12_4_ = fVar3 * auVar48._12_4_;
          auVar48 = vandps_avx(auVar79,auVar65);
          auVar48 = vmovlhps_avx(auVar79,auVar48);
          auVar69._0_4_ = auVar82._0_4_ + auVar48._0_4_;
          auVar69._4_4_ = auVar82._4_4_ + auVar48._4_4_;
          auVar69._8_4_ = auVar82._8_4_ + auVar48._8_4_;
          auVar69._12_4_ = auVar82._12_4_ + auVar48._12_4_;
          auVar82 = ZEXT1664(auVar69);
          pfVar37 = pfVar37 + (ulong)(~uVar16 >> 0x1f) * 2 + -1;
          lVar42 = lVar42 + 1;
        } while (lVar42 != 9);
        uVar21 = uVar21 + 0x18;
        uVar18 = uVar18 + (ulong)(-1 < (int)uVar36) * 2 + -1;
        lVar43 = lVar43 + 0x60;
        lVar45 = lVar45 + 0x60;
      } while (uVar21 < uVar36 * 0x18 + 0x198);
      fVar3 = gauss_s2_arr[lVar41];
      auVar14._4_4_ = fVar3;
      auVar14._0_4_ = fVar3;
      auVar14._8_4_ = fVar3;
      auVar14._12_4_ = fVar3;
      auVar50 = vmulps_avx512vl(auVar69,auVar14);
      lVar41 = lVar41 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar22) = auVar50;
      auVar72._0_4_ = auVar50._0_4_ * auVar50._0_4_;
      auVar72._4_4_ = auVar50._4_4_ * auVar50._4_4_;
      auVar72._8_4_ = auVar50._8_4_ * auVar50._8_4_;
      auVar72._12_4_ = auVar50._12_4_ * auVar50._12_4_;
      auVar48 = vmovshdup_avx(auVar72);
      auVar49 = vfmadd231ss_fma(auVar48,auVar50,auVar50);
      auVar48 = vshufpd_avx(auVar50,auVar50,1);
      auVar49 = vfmadd213ss_fma(auVar48,auVar48,auVar49);
      auVar48 = vshufps_avx(auVar50,auVar50,0xff);
      auVar48 = vfmadd213ss_fma(auVar48,auVar48,auVar49);
      fVar61 = fVar61 + auVar48._0_4_;
      lVar22 = lVar22 + 4;
      uVar36 = uVar36 + 5;
      uVar26 = uVar26 + 0x78;
      lVar38 = lVar38 + 0x1e0;
      lVar24 = lVar24 + 0x1e0;
    } while (iVar15 + 4 != (int)lVar41);
    lVar23 = lVar23 + 0x14;
    uVar17 = (ulong)(uVar16 + 5);
  } while ((int)uVar16 < 3);
  if (fVar61 < 0.0) {
    fVar61 = sqrtf(fVar61);
  }
  else {
    auVar48 = vsqrtss_avx(ZEXT416((uint)fVar61),ZEXT416((uint)fVar61));
    fVar61 = auVar48._0_4_;
  }
  auVar82 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar61)));
  lVar23 = 0;
  do {
    auVar86 = vmulps_avx512f(auVar82,*(undefined1 (*) [64])(ipoint->descriptor + lVar23));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar23) = auVar86;
    lVar23 = lVar23 + 0x10;
  } while (lVar23 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_4_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=4, k_count+=4) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=4, k_count+=4) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}